

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.c
# Opt level: O3

void uv__platform_invalidate_fd(uv_loop_t *loop,int fd)

{
  uv__io_t **ppuVar1;
  uv__io_t *puVar2;
  int *piVar3;
  long lVar4;
  epoll_event dummy;
  epoll_event local_10;
  
  ppuVar1 = loop->watchers;
  if (ppuVar1 == (uv__io_t **)0x0) {
    __assert_fail("loop->watchers != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/epoll.c"
                  ,0x37,"void uv__platform_invalidate_fd(uv_loop_t *, int)");
  }
  if (-1 < fd) {
    puVar2 = ppuVar1[loop->nwatchers + 1];
    if (puVar2 != (uv__io_t *)0x0 && ppuVar1[loop->nwatchers] != (uv__io_t *)0x0) {
      lVar4 = (long)puVar2->pending_queue + ((ulong)(puVar2 == (uv__io_t *)0x0) - 8);
      piVar3 = (int *)((long)&ppuVar1[loop->nwatchers]->cb + 4);
      do {
        if (*piVar3 == fd) {
          *piVar3 = -1;
        }
        piVar3 = piVar3 + 3;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
    if (-1 < loop->backend_fd) {
      local_10.data.fd = 0;
      local_10.events = 0;
      local_10._4_4_ = 0;
      epoll_ctl(loop->backend_fd,2,fd,&local_10);
    }
    return;
  }
  __assert_fail("fd >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/epoll.c"
                ,0x38,"void uv__platform_invalidate_fd(uv_loop_t *, int)");
}

Assistant:

void uv__platform_invalidate_fd(uv_loop_t* loop, int fd) {
  struct epoll_event* events;
  struct epoll_event dummy;
  uintptr_t i;
  uintptr_t nfds;

  assert(loop->watchers != NULL);
  assert(fd >= 0);

  events = (struct epoll_event*) loop->watchers[loop->nwatchers];
  nfds = (uintptr_t) loop->watchers[loop->nwatchers + 1];
  if (events != NULL)
    /* Invalidate events with same file descriptor */
    for (i = 0; i < nfds; i++)
      if (events[i].data.fd == fd)
        events[i].data.fd = -1;

  /* Remove the file descriptor from the epoll.
   * This avoids a problem where the same file description remains open
   * in another process, causing repeated junk epoll events.
   *
   * We pass in a dummy epoll_event, to work around a bug in old kernels.
   */
  if (loop->backend_fd >= 0) {
    /* Work around a bug in kernels 3.10 to 3.19 where passing a struct that
     * has the EPOLLWAKEUP flag set generates spurious audit syslog warnings.
     */
    memset(&dummy, 0, sizeof(dummy));
    epoll_ctl(loop->backend_fd, EPOLL_CTL_DEL, fd, &dummy);
  }
}